

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.h
# Opt level: O3

void __thiscall SplayTree<unsigned_long>::erase(SplayTree<unsigned_long> *this,unsigned_long value)

{
  Node *A;
  Node *pNVar1;
  long lVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node **ppNVar5;
  
  A = this->root;
  while( true ) {
    if (A == (Node *)0x0) {
      return;
    }
    lVar2 = 0x10;
    if ((value <= A->value) && (lVar2 = 8, A->value <= value)) break;
    A = *(Node **)((long)&A->value + lVar2);
  }
  splay(this,A);
  pNVar1 = A->left;
  pNVar4 = A->right;
  if (pNVar1 == (Node *)0x0) {
    pNVar3 = A->parent;
    if (pNVar3 != (Node *)0x0) {
      this = (SplayTree<unsigned_long> *)&pNVar3->right;
      if (pNVar3->left == A) {
        this = (SplayTree<unsigned_long> *)&pNVar3->left;
      }
    }
    *this = (SplayTree<unsigned_long>)pNVar4;
    if (pNVar4 == (Node *)0x0) goto LAB_001041c0;
  }
  else if (pNVar4 == (Node *)0x0) {
    pNVar3 = A->parent;
    if (pNVar3 != (Node *)0x0) {
      this = (SplayTree<unsigned_long> *)&pNVar3->right;
      if (pNVar3->left == A) {
        this = (SplayTree<unsigned_long> *)&pNVar3->left;
      }
    }
    *this = (SplayTree<unsigned_long>)pNVar1;
    pNVar4 = pNVar1;
  }
  else {
    do {
      pNVar3 = pNVar4;
      pNVar4 = pNVar3->left;
    } while (pNVar3->left != (Node *)0x0);
    pNVar1 = pNVar3->parent;
    if (pNVar1 != A) {
      pNVar4 = pNVar3->right;
      ppNVar5 = &this->root;
      if (pNVar1 != (Node *)0x0) {
        ppNVar5 = &pNVar1->right;
        if (pNVar1->left == pNVar3) {
          ppNVar5 = &pNVar1->left;
        }
      }
      *ppNVar5 = pNVar4;
      if (pNVar4 != (Node *)0x0) {
        pNVar4->parent = pNVar1;
      }
      pNVar1 = A->right;
      pNVar3->right = pNVar1;
      pNVar1->parent = pNVar3;
    }
    pNVar1 = A->parent;
    if (pNVar1 != (Node *)0x0) {
      this = (SplayTree<unsigned_long> *)&pNVar1->right;
      if (pNVar1->left == A) {
        this = (SplayTree<unsigned_long> *)&pNVar1->left;
      }
    }
    *this = (SplayTree<unsigned_long>)pNVar3;
    pNVar3->parent = pNVar1;
    pNVar4 = A->left;
    pNVar3->left = pNVar4;
  }
  pNVar4->parent = pNVar3;
LAB_001041c0:
  A->left = (Node *)0x0;
  A->right = (Node *)0x0;
  Node::~Node(A);
  operator_delete(A,0x20);
  return;
}

Assistant:

Node *get(const T &value) {
    Node *z = root;
    while (z) {
      if (z->value < value)
        z = z->right;
      else if (value < z->value)
        z = z->left;
      else
        return z;
    }
    return nullptr;
  }